

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.h
# Opt level: O1

named_arguments_t *
get_named_arguments(named_arguments_t *__return_storage_ptr__,cli_arguments_t *args)

{
  size_t sVar1;
  undefined4 uVar2;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>_>_>
  local_10;
  
  (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_bucket_count = (args->second)._M_h._M_bucket_count;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = (args->second)._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(args->second)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (args->second)._M_h._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor =
       (args->second)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy.field_0x4 = uVar2;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = sVar1;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_10._M_h = (__hashtable_alloc *)__return_storage_ptr__;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,char_const*>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,char_const*>,std::allocator<std::pair<std::__cxx11::string_const,char_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)__return_storage_ptr__,&(args->second)._M_h,&local_10);
  return __return_storage_ptr__;
}

Assistant:

const named_arguments_t get_named_arguments(const cli_arguments_t& args) { return args.second; }